

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::StringStreams::release(StringStreams *this,size_t index)

{
  reference this_00;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t local_18;
  size_t index_local;
  StringStreams *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  this_00 = std::
            vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_streams,index);
  pbVar1 = Detail::
           unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator->(this_00);
  std::ios::copyfmt((ios *)(pbVar1 + *(long *)(*(long *)pbVar1 + -0x18)));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&this->m_unused,&local_18);
  return;
}

Assistant:

void release(std::size_t index) {
            m_streams[index]->copyfmt(m_referenceStream); // Restore initial flags and other state
            m_unused.push_back(index);
        }